

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPHelperTests.cpp
# Opt level: O1

void __thiscall OpenMPHelperTest_Locks_Test::TestBody(OpenMPHelperTest_Locks_Test *this)

{
  return;
}

Assistant:

TEST(OpenMPHelperTest, Locks) {
    // test that lock functions do not crash
    omp_lock_t lock;
    omp_init_lock(&lock);
    omp_set_lock(&lock);
    omp_unset_lock(&lock);
    omp_destroy_lock(&lock);
}